

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::AtomicCounterTests::AtomicCounterTests
          (AtomicCounterTests *this,Context *context)

{
  int iVar1;
  Context *pCVar2;
  _Alloc_hider name;
  uint uVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  TestSpec *spec;
  TestSpec *spec_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  TestSpec *spec_01;
  TestSpec *spec_02;
  undefined8 uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  Operation operation;
  undefined4 local_24c;
  string local_248;
  int local_224;
  uint local_220;
  uint local_21c;
  int local_218;
  undefined4 uStack_214;
  uint uStack_210;
  uint uStack_20c;
  int local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  ulong local_1f8;
  TestNode *local_1f0;
  TestNode *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  TestNode *local_1d0;
  long local_1c8;
  TestNode *local_1c0;
  long local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar9 = "Atomic counter tests";
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"atomic_counter","Atomic counter tests");
  (this->super_TestCaseGroup).m_context = context;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterTests_021559a8;
  uVar15 = 0;
  do {
    local_24c = (&DAT_01c42720)[uVar15];
    local_1f0 = (TestNode *)CONCAT44(local_1f0._4_4_,local_24c);
    pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
    uVar12 = 0;
    local_1d8 = uVar15;
    do {
      local_220 = (uint)pcVar9;
      local_1e8 = (TestNode *)operator_new(0x78);
      local_224 = (int)uVar12;
      pCVar2 = (this->super_TestCaseGroup).m_context;
      bVar7 = SUB81(pcVar9,0);
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                ((string *)local_1a8,(_anonymous_namespace_ *)&local_24c,(Operation *)(uVar12 & 1),
                 bVar7);
      uVar11 = local_1a8._0_8_;
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_248,(_anonymous_namespace_ *)&local_24c,(Operation *)(uVar12 & 1),bVar7);
      pTVar5 = local_1e8;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_1e8,pCVar2->m_testCtx,(char *)uVar11,
                 local_248._M_dataplus._M_p);
      iVar13 = local_224;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      lVar14 = 0;
      do {
        iVar1 = (&DAT_01c426f0)[lVar14];
        lVar10 = 0;
        local_1f8 = lVar14;
        do {
          uVar3 = (&DAT_01c426fc)[lVar10];
          lVar14 = 0;
          local_21c = uVar3;
          local_1c8 = lVar10;
          do {
            iVar8 = *(int *)((long)&DAT_01c42708 + lVar14) * uVar3;
            if ((iVar8 == 1 & (byte)iVar13) == 0 && iVar8 * iVar1 < 0x2711) {
              uStack_214 = local_1f0._0_4_;
              uStack_20c = CONCAT31(uStack_20c._1_3_,(byte)iVar13);
              uStack_204 = 0;
              uStack_200 = 0;
              local_218 = iVar1;
              uStack_210 = uVar3;
              local_208 = *(int *)((long)&DAT_01c42708 + lVar14);
              pTVar4 = (TestNode *)operator_new(0x98);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        ((string *)local_1a8,(_anonymous_namespace_ *)&local_218,spec);
              uVar11 = local_1a8._0_8_;
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_248,(_anonymous_namespace_ *)&local_218,spec_00);
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)uVar11,
                         local_248._M_dataplus._M_p);
              pTVar5 = local_1e8;
              pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
              pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
              pTVar4[1].m_testCtx = (TestContext *)CONCAT44(uStack_214,local_218);
              pTVar4[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_20c,uStack_210);
              *(ulong *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_208,uStack_20c);
              *(ulong *)((long)&pTVar4[1].m_name._M_string_length + 4) =
                   CONCAT44(uStack_200,uStack_204);
              tcu::TestNode::addChild(local_1e8,pTVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              uVar3 = local_21c;
              iVar13 = local_224;
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
            }
            lVar14 = lVar14 + 4;
          } while (lVar14 != 0xc);
          lVar10 = local_1c8 + 1;
        } while (lVar10 != 3);
        lVar14 = local_1f8 + 1;
      } while (lVar14 != 3);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      uVar12 = CONCAT71((int7)((ulong)pTVar5 >> 8),1);
      pcVar9 = (char *)0x0;
    } while ((local_220 & 1) != 0);
    uVar15 = local_1d8 + 1;
  } while (uVar15 != 7);
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar2->m_testCtx,"layout","Layout qualifier tests.");
  ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar2;
  uVar15 = 0;
  local_1c0 = pTVar5;
  do {
    local_1f8 = (ulong)(uint)(&DAT_01b01270)[uVar15];
    local_1d0 = (TestNode *)operator_new(0x78);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar3 = (int)local_1f8 - 1;
    local_1e0 = uVar15;
    if (uVar3 < 6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,&DAT_01c427b4 + *(int *)(&DAT_01c427b4 + (ulong)uVar3 * 4),
                 *(long *)(&DAT_01c427d0 + (ulong)uVar3 * 8));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    name._M_p = local_248._M_dataplus._M_p;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Test using atomic counters with explicit layout bindings and",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               &DAT_01c42800 + *(int *)(&DAT_01c42800 + (long)(int)local_1f8 * 4),
               *(long *)(&DAT_01c42820 + (long)(int)local_1f8 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar5 = local_1d0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d0,pCVar2->m_testCtx,name._M_p,
               (char *)CONCAT44(uStack_214,local_218));
    uVar15 = local_1e0;
    ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
    ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar2;
    if ((int *)CONCAT44(uStack_214,local_218) != &local_208) {
      operator_delete((int *)CONCAT44(uStack_214,local_218),CONCAT44(uStack_204,local_208) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    local_1b0 = uVar15 & 0xffffffff;
    lVar14 = 0;
    do {
      local_24c = (&DAT_01c4273c)[lVar14];
      local_1c8 = CONCAT44(local_1c8._4_4_,local_24c);
      local_1b8 = lVar14;
      local_1f0 = (TestNode *)operator_new(0x78);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      bVar7 = SUB81(lVar14,0);
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                ((string *)local_1a8,(_anonymous_namespace_ *)&local_24c,(Operation *)0x0,bVar7);
      pcVar9 = (char *)local_1a8._0_8_;
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_248,(_anonymous_namespace_ *)&local_24c,(Operation *)0x0,bVar7);
      pTVar5 = local_1f0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_1f0,pCVar2->m_testCtx,pcVar9,local_248._M_dataplus._M_p);
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
      uVar11 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_00;
      }
      uVar15 = local_1e0;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        uVar11 = extraout_RDX_01;
      }
      uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
      lVar14 = 0;
      do {
        local_1d8 = CONCAT44(local_1d8._4_4_,(int)uVar11);
        if ((((uVar15 == 1 & (byte)uVar11) == 0) && (((byte)uVar11 & 1 < local_1e0) == 0)) &&
           (lVar14 != 0 || local_1b0 != 0)) {
          local_224 = (&DAT_01c4349c)[lVar14];
          uVar3 = 0x1c43401;
          lVar14 = 0;
          do {
            local_1e8 = (TestNode *)CONCAT44(local_1e8._4_4_,(&DAT_01c434a4)[lVar14]);
            pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
            lVar14 = 0;
            local_220 = uVar3;
            do {
              local_208 = (&DAT_01c434ac)[lVar14];
              local_218 = local_224;
              uStack_214 = (undefined4)local_1c8;
              uStack_210 = (uint)local_1e8;
              uStack_20c = uStack_20c & 0xffffff00;
              uStack_200 = 0;
              uStack_204 = (undefined4)local_1f8;
              pTVar4 = (TestNode *)operator_new(0x98);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        ((string *)local_1a8,(_anonymous_namespace_ *)&local_218,spec_01);
              uVar11 = local_1a8._0_8_;
              local_21c = (uint)pcVar9;
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_248,(_anonymous_namespace_ *)&local_218,spec_02);
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)uVar11,
                         local_248._M_dataplus._M_p);
              pTVar5 = local_1f0;
              pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
              pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
              pTVar4[1].m_testCtx = (TestContext *)CONCAT44(uStack_214,local_218);
              pTVar4[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_20c,uStack_210);
              *(ulong *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_208,uStack_20c);
              *(ulong *)((long)&pTVar4[1].m_name._M_string_length + 4) =
                   CONCAT44(uStack_200,uStack_204);
              tcu::TestNode::addChild(local_1f0,pTVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              lVar14 = 1;
              pcVar9 = (char *)0x0;
            } while ((local_21c & 1) != 0);
            uVar3 = 0;
          } while ((local_220 & 1) != 0);
        }
        pTVar4 = local_1d0;
        uVar15 = local_1e0;
        lVar14 = 1;
        uVar11 = 0;
      } while ((local_1d8 & 1) != 0);
      tcu::TestNode::addChild(local_1d0,pTVar5);
      pTVar5 = local_1c0;
      lVar14 = local_1b8 + 1;
    } while (lVar14 != 3);
    tcu::TestNode::addChild(local_1c0,pTVar4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"invalid","Test invalid layouts");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"invalid_binding",
             "Test layout qualifiers with invalid binding.");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
  pTVar6[1].m_testCtx = (TestContext *)&DAT_100000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar6[1].m_name._M_string_length = 1;
  *(undefined4 *)&pTVar6[1].m_name.field_2 = 1;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"invalid_default_binding",
             "Test layout qualifiers with invalid default binding.");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
  pTVar6[1].m_testCtx = (TestContext *)&DAT_100000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar6[1].m_name._M_string_length = 1;
  *(undefined4 *)&pTVar6[1].m_name.field_2 = 2;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"invalid_offset_align",
             "Test layout qualifiers with invalid alignment offset.");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
  pTVar6[1].m_testCtx = (TestContext *)&DAT_100000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar6[1].m_name._M_string_length = (size_type)&DAT_600000001;
  *(undefined4 *)&pTVar6[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"invalid_offset_overlap",
             "Test layout qualifiers with invalid overlapping offset.");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
  pTVar6[1].m_testCtx = (TestContext *)0x100000002;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar6[1].m_name._M_string_length = 0x700000001;
  *(undefined4 *)&pTVar6[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"invalid_default_offset",
             "Test layout qualifiers with invalid default offset.");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021559f8;
  pTVar6[1].m_testCtx = (TestContext *)&DAT_100000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar6[1].m_name._M_string_length = 0x800000001;
  *(undefined4 *)&pTVar6[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  tcu::TestNode::addChild(pTVar5,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  return;
}

Assistant:

AtomicCounterTests::AtomicCounterTests (Context& context)
	: TestCaseGroup(context, "atomic_counter", "Atomic counter tests")
{
	// Runtime use tests
	{
		const int counterCounts[] =
		{
			1, 4, 8
		};

		const int callCounts[] =
		{
			1, 5, 100
		};

		const int threadCounts[] =
		{
			1, 10, 5000
		};

		const AtomicCounterTest::Operation operations[] =
		{
			AtomicCounterTest::OPERATION_GET,
			AtomicCounterTest::OPERATION_INC,
			AtomicCounterTest::OPERATION_DEC,

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET)
		};

		for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
		{
			const AtomicCounterTest::Operation operation = operations[operationNdx];

			for (int branch = 0; branch < 2; branch++)
			{
				const bool useBranch = (branch == 1);

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, useBranch).c_str(), operationToDescription(operation, useBranch).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							if (threadCount * callCount * counterCount > 10000)
								continue;

							if (useBranch && threadCount * callCount == 1)
								continue;

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= useBranch;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}

				addChild(operationGroup);
			}
		}
	}

	{
		TestCaseGroup* layoutGroup = new TestCaseGroup(m_context, "layout", "Layout qualifier tests.");

		const int counterCounts[]	= { 1, 8 };
		const int callCounts[]		= { 1, 5 };
		const int threadCounts[]	= { 1, 1000 };

		const AtomicCounterTest::Operation operations[] =
		{
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC)
		};

		const AtomicCounterTest::OffsetType offsetTypes[] =
		{
			AtomicCounterTest::OFFSETTYPE_REVERSE,
			AtomicCounterTest::OFFSETTYPE_FIRST_AUTO,
			AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO,
			AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT
		};

		for (int offsetTypeNdx = 0; offsetTypeNdx < DE_LENGTH_OF_ARRAY(offsetTypes); offsetTypeNdx++)
		{
			const AtomicCounterTest::OffsetType offsetType = offsetTypes[offsetTypeNdx];

			TestCaseGroup* layoutQualifierGroup = new TestCaseGroup(m_context, layoutTypesToName(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str(), layoutTypesToDesc(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str());

			for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
			{
				const AtomicCounterTest::Operation operation = operations[operationNdx];

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, false).c_str(), operationToDescription(operation, false).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					if (offsetType == AtomicCounterTest::OFFSETTYPE_FIRST_AUTO && counterCount < 3)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_REVERSE && counterCount < 2)
						continue;

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= false;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= offsetType;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}
				layoutQualifierGroup->addChild(operationGroup);
			}
			layoutGroup->addChild(layoutQualifierGroup);
		}

		{
			TestCaseGroup* invalidGroup = new TestCaseGroup(m_context, "invalid", "Test invalid layouts");

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_binding", "Test layout qualifiers with invalid binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID_DEFAULT;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_binding", "Test layout qualifiers with invalid default binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_align", "Test layout qualifiers with invalid alignment offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 2;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_OVERLAPPING;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_overlap", "Test layout qualifiers with invalid overlapping offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_DEFAULT;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_offset", "Test layout qualifiers with invalid default offset.", spec));
			}

			layoutGroup->addChild(invalidGroup);
		}

		addChild(layoutGroup);
	}
}